

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

void Js::JavascriptExceptionOperators::Throw(Var object,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptError *pJVar4;
  Recycler *alloc;
  JavascriptExceptionObject *pJVar5;
  byte resetStack;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x418,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) goto LAB_00a957f4;
    *puVar3 = 0;
  }
  if (scriptContext->threadContext->callRootLevel == 0) {
    bVar2 = VarIs<Js::JavascriptError>(object);
    if (bVar2) {
      pJVar4 = VarTo<Js::JavascriptError>(object);
      if (pJVar4->isExternalError != 0) goto LAB_00a957c2;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x41f,
                       "(scriptContext->GetThreadContext()->IsInScript() || (VarIs<JavascriptError>(object) && (VarTo<JavascriptError>(object))->IsExternalError()))"
                       ,"Javascript exception raised without being in CallRootFunction");
    if (!bVar2) {
LAB_00a957f4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
LAB_00a957c2:
  bVar2 = VarIs<Js::JavascriptError>(object);
  if (bVar2) {
    pJVar4 = VarTo<Js::JavascriptError>(object);
    pJVar5 = (pJVar4->exceptionObject).ptr;
    if (pJVar5 != (JavascriptExceptionObject *)0x0) {
      ThrowExceptionObject(pJVar5,scriptContext,true,(PVOID)0x0,false);
    }
  }
  else {
    pJVar4 = (JavascriptError *)0x0;
  }
  local_58 = (undefined1  [8])&JavascriptExceptionObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4dbc29c;
  data.filename._0_4_ = 0x42f;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  resetStack = false;
  pJVar5 = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,alloc,0x387914);
  JavascriptExceptionObject::JavascriptExceptionObject
            (pJVar5,object,scriptContext,(JavascriptExceptionContext *)0x0,false);
  if (pJVar4 != (JavascriptError *)0x0) {
    resetStack = pJVar4->isStackPropertyRedefined ^ 1;
    Memory::Recycler::WBSetBit((char *)&pJVar4->exceptionObject);
    (pJVar4->exceptionObject).ptr = pJVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pJVar4->exceptionObject);
  }
  ThrowExceptionObject(pJVar5,scriptContext,true,(PVOID)0x0,(bool)resetStack);
}

Assistant:

void JavascriptExceptionOperators::Throw(Var object, ScriptContext * scriptContext)
    {
#if defined(DBG) && defined(_M_IX86)
        DbgCheckEHChain();
#endif

        Assert(scriptContext != nullptr);
        // TODO: FastDOM Trampolines will throw JS Exceptions but are not isScriptActive
        //AssertMsg(scriptContext->GetThreadContext()->IsScriptActive() ||
        //          (VarIs<JavascriptError>(object) && (VarTo<JavascriptError>(object))->IsExternalError()),
        //    "Javascript exception raised when script is not active");
        AssertMsg(scriptContext->GetThreadContext()->IsInScript() ||
            (VarIs<JavascriptError>(object) && (VarTo<JavascriptError>(object))->IsExternalError()),
            "Javascript exception raised without being in CallRootFunction");

        JavascriptError *javascriptError = nullptr;
        if (VarIs<JavascriptError>(object))
        {
            // We keep track of the JavascriptExceptionObject that was created when this error
            // was first thrown so that we can always get the correct metadata.
            javascriptError = VarTo<JavascriptError>(object);
            JavascriptExceptionObject *exceptionObject = javascriptError->GetJavascriptExceptionObject();
            if (exceptionObject)
            {
                JavascriptExceptionOperators::ThrowExceptionObject(exceptionObject, scriptContext, true);
            }
        }

        JavascriptExceptionObject * exceptionObject =
            RecyclerNew(scriptContext->GetRecycler(), JavascriptExceptionObject, object, scriptContext, NULL);

        bool resetStack = false;
        if (javascriptError)
        {
            if (!javascriptError->IsStackPropertyRedefined())
            {
                /*
                    Throwing an error object. Original stack property will be pointing to the stack created at time of Error constructor.
                    Reset the stack property to match IE11 behavior
                */
                resetStack = true;
            }
            javascriptError->SetJavascriptExceptionObject(exceptionObject);
        }

        JavascriptExceptionOperators::ThrowExceptionObject(exceptionObject, scriptContext, /*considerPassingToDebugger=*/ true, /*returnAddress=*/ nullptr, resetStack);
    }